

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O0

void S2RegionCoverer::FloodFill
               (S2Region *region,S2CellId start,vector<S2CellId,_std::allocator<S2CellId>_> *output)

{
  pointer *this;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  pair<std::__detail::_Node_iterator<S2CellId,_true,_true>,_bool> pVar4;
  S2CellId *local_160;
  value_type local_108;
  S2CellId nbr;
  int edge;
  S2CellId neighbors [4];
  S2Cell local_d0;
  S2CellId local_98;
  S2CellId id;
  undefined1 local_70 [8];
  vector<S2CellId,_std::allocator<S2CellId>_> frontier;
  unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_> all;
  vector<S2CellId,_std::allocator<S2CellId>_> *output_local;
  S2Region *region_local;
  S2CellId start_local;
  
  this = &frontier.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  region_local = (S2Region *)start.id_;
  std::unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_>::
  unordered_set((unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_>
                 *)this);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_70);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::clear(output);
  pVar4 = std::
          unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_>
          ::insert((unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_>
                    *)this,(value_type *)&region_local);
  id.id_ = (uint64)pVar4.first.super__Node_iterator_base<S2CellId,_true>._M_cur;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_70,(value_type *)&region_local);
  while (bVar1 = std::vector<S2CellId,_std::allocator<S2CellId>_>::empty
                           ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_70),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::vector<S2CellId,_std::allocator<S2CellId>_>::back
                       ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_70);
    local_98.id_ = pvVar3->id_;
    std::vector<S2CellId,_std::allocator<S2CellId>_>::pop_back
              ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_70);
    neighbors[3].id_ = local_98.id_;
    S2Cell::S2Cell(&local_d0,local_98);
    iVar2 = (*region->_vptr_S2Region[7])(region,&local_d0);
    S2Cell::~S2Cell(&local_d0);
    if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
      std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(output,&local_98);
      local_160 = (S2CellId *)&stack0xffffffffffffff08;
      do {
        S2CellId::S2CellId(local_160);
        local_160 = local_160 + 1;
      } while (local_160 != neighbors + 3);
      S2CellId::GetEdgeNeighbors(&local_98,(S2CellId *)&stack0xffffffffffffff08);
      for (nbr.id_._4_4_ = 0; nbr.id_._4_4_ < 4; nbr.id_._4_4_ = nbr.id_._4_4_ + 1) {
        local_108.id_ = *(uint64 *)(&stack0xffffffffffffff08 + (long)nbr.id_._4_4_ * 8);
        pVar4 = std::
                unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_>
                ::insert((unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_>
                          *)&frontier.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,&local_108);
        if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
                    ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_70,&local_108);
        }
      }
    }
  }
  std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_70);
  std::unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_>::
  ~unordered_set((unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_>
                  *)&frontier.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void S2RegionCoverer::FloodFill(const S2Region& region, S2CellId start,
                                vector<S2CellId>* output) {
  unordered_set<S2CellId, S2CellIdHash> all;
  vector<S2CellId> frontier;
  output->clear();
  all.insert(start);
  frontier.push_back(start);
  while (!frontier.empty()) {
    S2CellId id = frontier.back();
    frontier.pop_back();
    if (!region.MayIntersect(S2Cell(id))) continue;
    output->push_back(id);

    S2CellId neighbors[4];
    id.GetEdgeNeighbors(neighbors);
    for (int edge = 0; edge < 4; ++edge) {
      S2CellId nbr = neighbors[edge];
      if (all.insert(nbr).second) {
        frontier.push_back(nbr);
      }
    }
  }
}